

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::DistantLight>::transform
          (LightNodeImpl<embree::SceneGraph::DistantLight> *this,AffineSpace3fa *space)

{
  _func_int **pp_Var1;
  DistantLight *in_RSI;
  LightNodeImpl<embree::SceneGraph::DistantLight> *in_RDI;
  LightNodeImpl<embree::SceneGraph::DistantLight> *this_00;
  
  this_00 = in_RDI;
  pp_Var1 = (_func_int **)operator_new(0x17c1e3);
  DistantLight::transform(in_RSI,(AffineSpace3fa *)this_00);
  LightNodeImpl(this_00,(DistantLight *)in_RDI);
  (in_RDI->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var1;
  if ((in_RDI->super_LightNode).super_Node.super_RefCount._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_LightNode).super_Node.super_RefCount._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::LightNode>)&this_00->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const {
        return new LightNodeImpl(light.transform(space));
      }